

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_service_handler(t_c_glib_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  string *psVar3;
  t_field *ptVar4;
  t_type *ptVar5;
  t_struct *ptVar6;
  t_struct *ptVar7;
  pointer pptVar8;
  pointer pptVar9;
  pointer pptVar10;
  t_function *ptVar11;
  int iVar12;
  undefined4 extraout_var;
  ostream *poVar13;
  pointer pptVar14;
  pointer pptVar15;
  allocator local_62e;
  allocator local_62d;
  allocator local_62c;
  allocator local_62b;
  allocator local_62a;
  allocator local_629;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_628;
  pointer local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  string parent_service_name_lc;
  string parent_service_name_uc;
  string class_name;
  string class_name_lc;
  string service_name_uc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string parent_service_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string args_indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string service_name_lc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string parent_class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string parent_type_name;
  string class_name_uc;
  string service_handler_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  local_628 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::__cxx11::string::string((string *)&local_1b0,(string *)local_628);
  initial_caps_to_underscores(&local_190,&local_1b0);
  to_lower_case(&service_name_lc,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&service_name_lc);
  to_upper_case(&service_name_uc,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&service_handler_name,local_628,"Handler");
  local_618 = &this->nspace;
  std::operator+(&class_name,local_618,&service_handler_name);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&service_handler_name);
  initial_caps_to_underscores(&parent_service_name,&local_1f0);
  std::operator+(&class_name_lc,&this->nspace_lc,&parent_service_name);
  std::__cxx11::string::~string((string *)&parent_service_name);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,(string *)&class_name_lc);
  to_upper_case(&class_name_uc,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  parent_class_name._M_dataplus._M_p = (pointer)&parent_class_name.field_2;
  parent_class_name._M_string_length = 0;
  parent_class_name.field_2._M_local_buf[0] = '\0';
  parent_type_name._M_dataplus._M_p = (pointer)&parent_type_name.field_2;
  parent_type_name._M_string_length = 0;
  args_indent._M_dataplus._M_p = (pointer)&args_indent.field_2;
  args_indent._M_string_length = 0;
  parent_type_name.field_2._M_local_buf[0] = '\0';
  args_indent.field_2._M_local_buf[0] = '\0';
  if (tservice->extends_ == (t_service *)0x0) {
    std::__cxx11::string::assign((char *)&parent_class_name);
    std::__cxx11::string::assign((char *)&parent_type_name);
  }
  else {
    iVar12 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)&parent_service_name,(string *)CONCAT44(extraout_var,iVar12));
    std::__cxx11::string::string((string *)&local_250,(string *)&parent_service_name);
    initial_caps_to_underscores(&local_230,&local_250);
    to_lower_case(&parent_service_name_lc,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string((string *)&local_270,(string *)&parent_service_name_lc);
    to_upper_case(&parent_service_name_uc,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator+(&local_5d8,local_618,&parent_service_name);
    std::operator+(&local_610,&local_5d8,"Handler");
    std::__cxx11::string::operator=((string *)&parent_class_name,(string *)&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::operator+(&local_510,&this->nspace_uc,"TYPE_");
    std::operator+(&local_5d8,&local_510,&parent_service_name_uc);
    std::operator+(&local_610,&local_5d8,"_HANDLER");
    std::__cxx11::string::operator=((string *)&parent_type_name,(string *)&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&parent_service_name_uc);
    std::__cxx11::string::~string((string *)&parent_service_name_lc);
    std::__cxx11::string::~string((string *)&parent_service_name);
  }
  poVar1 = &this->f_header_;
  poVar13 = std::operator<<((ostream *)poVar1,"/* ");
  poVar13 = std::operator<<(poVar13,(string *)local_628);
  poVar13 = std::operator<<(poVar13," handler (abstract base class) */");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"struct _");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"{");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&parent_service_name,(t_generator *)this);
  poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name);
  poVar13 = std::operator<<(poVar13,(string *)&parent_class_name);
  poVar13 = std::operator<<(poVar13," parent;");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&parent_service_name);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar13 = std::operator<<((ostream *)poVar1,"};");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"typedef struct _");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13," ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,";");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<((ostream *)poVar1,"struct _");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"{");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&parent_service_name,(t_generator *)this);
  poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name);
  poVar13 = std::operator<<(poVar13,(string *)&parent_class_name);
  poVar13 = std::operator<<(poVar13,"Class parent;");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&parent_service_name);
  pptVar15 = (pointer)functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pptVar15 ==
        (pointer)functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::string((string *)&local_290,(string *)&(*pptVar15)->name_);
    initial_caps_to_underscores(&parent_service_name,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    ptVar4 = *pptVar15;
    ptVar5 = ptVar4->type_;
    ptVar6 = *(t_struct **)&ptVar4->key_;
    ptVar7 = (t_struct *)ptVar4->value_;
    local_620 = pptVar15;
    iVar12 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])(ptVar5);
    pptVar8 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar9 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pptVar15 = (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pptVar10 = (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::operator+(&local_410,"(",local_618);
    std::operator+(&local_3b0,&local_410,local_628);
    std::operator+(&local_510,&local_3b0,"If *iface");
    if ((char)iVar12 == '\0') {
      type_name_abi_cxx11_(&local_d0,this,ptVar5,false,false);
      std::operator+(&local_b0,", ",&local_d0);
      std::operator+(&local_450,&local_b0,"* _return");
    }
    else {
      std::__cxx11::string::string((string *)&local_450,"",&local_629);
    }
    std::operator+(&local_5d8,&local_510,&local_450);
    if (pptVar9 == pptVar8) {
      std::__cxx11::string::string((string *)&local_3d0,"",&local_62a);
    }
    else {
      argument_list_abi_cxx11_(&local_f0,this,ptVar6);
      std::operator+(&local_3d0,", ",&local_f0);
    }
    std::operator+(&local_610,&local_5d8,&local_3d0);
    if (pptVar10 == pptVar15) {
      std::__cxx11::string::string((string *)&local_370,"",&local_62b);
    }
    else {
      xception_list_abi_cxx11_(&local_110,this,ptVar7);
      std::operator+(&local_370,", ",&local_110);
    }
    std::operator+(&parent_service_name_uc,&local_610,&local_370);
    std::operator+(&parent_service_name_lc,&parent_service_name_uc,", GError **error)");
    std::__cxx11::string::~string((string *)&parent_service_name_uc);
    std::__cxx11::string::~string((string *)&local_370);
    if (pptVar10 != pptVar15) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    pptVar15 = local_620;
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_3d0);
    if (pptVar9 != pptVar8) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_450);
    if ((char)iVar12 == '\0') {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_410);
    poVar13 = t_generator::indent((t_generator *)this,(ostream *)poVar1);
    poVar13 = std::operator<<(poVar13,"gboolean (*");
    poVar13 = std::operator<<(poVar13,(string *)&parent_service_name);
    poVar13 = std::operator<<(poVar13,") ");
    poVar13 = std::operator<<(poVar13,(string *)&parent_service_name_lc);
    poVar13 = std::operator<<(poVar13,";");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&parent_service_name_lc);
    std::__cxx11::string::~string((string *)&parent_service_name);
    pptVar15 = pptVar15 + 1;
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar13 = std::operator<<((ostream *)poVar1,"};");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"typedef struct _");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class;");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<((ostream *)poVar1,"GType ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_get_type (void);");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  psVar3 = &this->nspace_uc;
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER ");
  poVar13 = std::operator<<(poVar13,"(");
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_get_type())");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name_uc);
  poVar13 = std::operator<<(poVar13,"(obj) ");
  poVar13 = std::operator<<(poVar13,"(G_TYPE_CHECK_INSTANCE_CAST ((obj), ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER, ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"IS_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER(obj) ");
  poVar13 = std::operator<<(poVar13,"(G_TYPE_CHECK_INSTANCE_TYPE ((obj), ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name_uc);
  poVar13 = std::operator<<(poVar13,"_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER, ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"IS_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER_CLASS(c) ");
  poVar13 = std::operator<<(poVar13,"(G_TYPE_CHECK_CLASS_TYPE ((c), ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,"#define ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER_GET_CLASS(obj) ");
  poVar13 = std::operator<<(poVar13,"(G_TYPE_INSTANCE_GET_CLASS ((obj), ");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_HANDLER, ");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  pptVar14 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  while( true ) {
    if (pptVar14 ==
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::string((string *)&local_2b0,(string *)&(*pptVar14)->name_);
    initial_caps_to_underscores(&parent_service_name,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    ptVar11 = *pptVar14;
    ptVar5 = ptVar11->returntype_;
    ptVar6 = ptVar11->arglist_;
    ptVar7 = ptVar11->xceptions_;
    iVar12 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])(ptVar5);
    pptVar15 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pptVar8 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pptVar9 = (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_620 = (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    std::operator+(&local_410,"(",local_618);
    std::operator+(&local_3b0,&local_410,local_628);
    std::operator+(&local_510,&local_3b0,"If *iface");
    if ((char)iVar12 == '\0') {
      type_name_abi_cxx11_(&local_370,this,ptVar5,false,false);
      std::operator+(&local_3d0,", ",&local_370);
      std::operator+(&local_450,&local_3d0,"* _return");
    }
    else {
      std::__cxx11::string::string((string *)&local_450,"",&local_62c);
    }
    std::operator+(&local_5d8,&local_510,&local_450);
    if (pptVar8 == pptVar15) {
      std::__cxx11::string::string((string *)&local_2d0,"",&local_62d);
    }
    else {
      argument_list_abi_cxx11_(&local_130,this,ptVar6);
      std::operator+(&local_2d0,", ",&local_130);
    }
    std::operator+(&local_610,&local_5d8,&local_2d0);
    if (local_620 == pptVar9) {
      std::__cxx11::string::string((string *)&local_2f0,"",&local_62e);
    }
    else {
      xception_list_abi_cxx11_(&local_150,this,ptVar7);
      std::operator+(&local_2f0,", ",&local_150);
    }
    std::operator+(&parent_service_name_uc,&local_610,&local_2f0);
    std::operator+(&parent_service_name_lc,&parent_service_name_uc,", GError **error)");
    std::__cxx11::string::~string((string *)&parent_service_name_uc);
    std::__cxx11::string::~string((string *)&local_2f0);
    if (local_620 != pptVar9) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (pptVar8 != pptVar15) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_450);
    if ((char)iVar12 == '\0') {
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_370);
    }
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_410);
    poVar13 = std::operator<<((ostream *)poVar1,"gboolean ");
    poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
    poVar13 = std::operator<<(poVar13,"_");
    poVar13 = std::operator<<(poVar13,(string *)&parent_service_name);
    poVar13 = std::operator<<(poVar13," ");
    poVar13 = std::operator<<(poVar13,(string *)&parent_service_name_lc);
    poVar13 = std::operator<<(poVar13,";");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&parent_service_name_lc);
    std::__cxx11::string::~string((string *)&parent_service_name);
    pptVar14 = pptVar14 + 1;
  }
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = &this->f_service_;
  poVar13 = std::operator<<((ostream *)poVar1,"static void");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_lc);
  poVar13 = std::operator<<(poVar13,"_if_interface_init (");
  poVar13 = std::operator<<(poVar13,(string *)local_618);
  poVar13 = std::operator<<(poVar13,(string *)local_628);
  poVar13 = std::operator<<(poVar13,"IfInterface *iface);");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  parent_service_name._M_dataplus._M_p = (pointer)&parent_service_name.field_2;
  std::__cxx11::string::_M_construct((ulong)&parent_service_name,'\x19');
  std::__cxx11::string::operator=((string *)&args_indent,(string *)&parent_service_name);
  std::__cxx11::string::~string((string *)&parent_service_name);
  poVar13 = std::operator<<((ostream *)poVar1,"G_DEFINE_TYPE_WITH_CODE (");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,", ");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&args_indent);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,",");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&args_indent);
  poVar13 = std::operator<<(poVar13,(string *)&parent_type_name);
  poVar13 = std::operator<<(poVar13,",");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&args_indent);
  poVar13 = std::operator<<(poVar13,"G_IMPLEMENT_INTERFACE (");
  poVar13 = std::operator<<(poVar13,(string *)psVar3);
  poVar13 = std::operator<<(poVar13,"TYPE_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
  poVar13 = std::operator<<(poVar13,"_IF,");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  parent_service_name._M_dataplus._M_p = (pointer)&parent_service_name.field_2;
  std::__cxx11::string::_M_construct((ulong)&parent_service_name,'\x17');
  std::__cxx11::string::append((string *)&args_indent);
  std::__cxx11::string::~string((string *)&parent_service_name);
  poVar13 = std::operator<<((ostream *)poVar1,(string *)&args_indent);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_lc);
  poVar13 = std::operator<<(poVar13,"_if_interface_init))");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  for (pptVar14 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pptVar14 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
    std::__cxx11::string::string((string *)&parent_service_name_lc,(string *)&(*pptVar14)->name_);
    std::__cxx11::string::string((string *)&local_50,(string *)&parent_service_name_lc);
    initial_caps_to_underscores(&parent_service_name_uc,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ptVar11 = *pptVar14;
    ptVar5 = ptVar11->returntype_;
    ptVar6 = ptVar11->arglist_;
    ptVar7 = ptVar11->xceptions_;
    std::operator+(&local_610,&service_name_lc,"_handler_");
    std::operator+(&local_170,&local_610,&parent_service_name_uc);
    t_function::t_function
              ((t_function *)&parent_service_name,ptVar5,&local_170,ptVar6,ptVar7,
               (*pptVar14)->oneway_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_610);
    poVar13 = t_generator::indent((t_generator *)this,(ostream *)poVar1);
    function_signature_abi_cxx11_(&local_610,this,(t_function *)&parent_service_name);
    poVar13 = std::operator<<(poVar13,(string *)&local_610);
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_610);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
    t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
    poVar13 = std::operator<<((ostream *)poVar1,(string *)&local_610);
    poVar13 = std::operator<<(poVar13,"g_return_val_if_fail (");
    poVar13 = std::operator<<(poVar13,(string *)psVar3);
    poVar13 = std::operator<<(poVar13,"IS_");
    poVar13 = std::operator<<(poVar13,(string *)&service_name_uc);
    poVar13 = std::operator<<(poVar13,"_HANDLER (iface), FALSE);");
    poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5d8,(t_generator *)this);
    poVar13 = std::operator<<(poVar13,(string *)&local_5d8);
    poVar13 = std::operator<<(poVar13,"return ");
    poVar13 = std::operator<<(poVar13,(string *)&class_name_uc);
    poVar13 = std::operator<<(poVar13,"_GET_CLASS (iface)");
    poVar13 = std::operator<<(poVar13,"->");
    poVar13 = std::operator<<(poVar13,(string *)&parent_service_name_uc);
    std::operator<<(poVar13," (iface, ");
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_610);
    iVar12 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar12 == '\0') {
      std::operator<<((ostream *)poVar1,"_return, ");
    }
    for (pptVar15 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      poVar13 = std::operator<<((ostream *)poVar1,(string *)&(*pptVar15)->name_);
      std::operator<<(poVar13,", ");
    }
    for (pptVar15 = (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (ptVar7->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      poVar13 = std::operator<<((ostream *)poVar1,(string *)&(*pptVar15)->name_);
      std::operator<<(poVar13,", ");
    }
    poVar13 = std::operator<<((ostream *)poVar1,"error);");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
    t_function::~t_function((t_function *)&parent_service_name);
    std::__cxx11::string::~string((string *)&parent_service_name_uc);
    std::__cxx11::string::~string((string *)&parent_service_name_lc);
  }
  poVar13 = std::operator<<((ostream *)poVar1,"static void");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_");
  poVar13 = std::operator<<(poVar13,(string *)&service_name_lc);
  poVar13 = std::operator<<(poVar13,"_if_interface_init (");
  poVar13 = std::operator<<(poVar13,(string *)local_618);
  poVar13 = std::operator<<(poVar13,(string *)local_628);
  poVar13 = std::operator<<(poVar13,"IfInterface *iface)");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar13 = std::operator<<((ostream *)poVar1,"THRIFT_UNUSED_VAR (iface);");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  }
  else {
    for (pptVar14 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar14 !=
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
      std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar14)->name_);
      initial_caps_to_underscores(&parent_service_name,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      t_generator::indent_abi_cxx11_(&parent_service_name_lc,(t_generator *)this);
      poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name_lc);
      poVar13 = std::operator<<(poVar13,"iface->");
      poVar13 = std::operator<<(poVar13,(string *)&parent_service_name);
      poVar13 = std::operator<<(poVar13," = ");
      poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
      poVar13 = std::operator<<(poVar13,"_");
      poVar13 = std::operator<<(poVar13,(string *)&parent_service_name);
      poVar13 = std::operator<<(poVar13,";");
      std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&parent_service_name_lc);
      std::__cxx11::string::~string((string *)&parent_service_name);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<((ostream *)poVar1,"static void");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_init (");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13," *self)");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&parent_service_name,(t_generator *)this);
  poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name);
  poVar13 = std::operator<<(poVar13,"THRIFT_UNUSED_VAR (self);");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&parent_service_name);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<((ostream *)poVar1,"static void");
  poVar13 = std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  poVar13 = std::operator<<(poVar13,(string *)&class_name_lc);
  poVar13 = std::operator<<(poVar13,"_class_init (");
  poVar13 = std::operator<<(poVar13,(string *)&class_name);
  poVar13 = std::operator<<(poVar13,"Class *cls)");
  std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&parent_service_name,(t_generator *)this);
    poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name);
    poVar13 = std::operator<<(poVar13,"THRIFT_UNUSED_VAR (cls);");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&parent_service_name);
  }
  else {
    for (pptVar14 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar14 !=
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
      std::__cxx11::string::string((string *)&parent_service_name,(string *)&(*pptVar14)->name_);
      std::__cxx11::string::string((string *)&local_90,(string *)&parent_service_name);
      initial_caps_to_underscores(&parent_service_name_lc,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      t_generator::indent_abi_cxx11_(&parent_service_name_uc,(t_generator *)this);
      poVar13 = std::operator<<((ostream *)poVar1,(string *)&parent_service_name_uc);
      poVar13 = std::operator<<(poVar13,"cls->");
      poVar13 = std::operator<<(poVar13,(string *)&parent_service_name_lc);
      poVar13 = std::operator<<(poVar13," = NULL;");
      std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&parent_service_name_uc);
      std::__cxx11::string::~string((string *)&parent_service_name_lc);
      std::__cxx11::string::~string((string *)&parent_service_name);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&args_indent);
  std::__cxx11::string::~string((string *)&parent_type_name);
  std::__cxx11::string::~string((string *)&parent_class_name);
  std::__cxx11::string::~string((string *)&class_name_uc);
  std::__cxx11::string::~string((string *)&class_name_lc);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::~string((string *)&service_handler_name);
  std::__cxx11::string::~string((string *)&service_name_uc);
  std::__cxx11::string::~string((string *)&service_name_lc);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_c_glib_generator::generate_service_handler(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator function_iter;

  string service_name_lc = to_lower_case(initial_caps_to_underscores(service_name_));
  string service_name_uc = to_upper_case(service_name_lc);

  string service_handler_name = service_name_ + "Handler";

  string class_name = this->nspace + service_handler_name;
  string class_name_lc = this->nspace_lc + initial_caps_to_underscores(service_handler_name);
  string class_name_uc = to_upper_case(class_name_lc);

  string parent_class_name;
  string parent_type_name;

  string args_indent;

  // The service this service extends, or nullptr if it extends no service
  t_service* extends_service = tservice->get_extends();

  // Determine the name of our parent service (if any) and the handler class'
  // parent class name and type
  if (extends_service) {
    string parent_service_name = extends_service->get_name();
    string parent_service_name_lc = to_lower_case(initial_caps_to_underscores(parent_service_name));
    string parent_service_name_uc = to_upper_case(parent_service_name_lc);

    parent_class_name = this->nspace + parent_service_name + "Handler";
    parent_type_name = this->nspace_uc + "TYPE_" + parent_service_name_uc + "_HANDLER";
  } else {
    parent_class_name = "GObject";
    parent_type_name = "G_TYPE_OBJECT";
  }

  // Generate the handler class' definition in the header file

  // Generate the handler instance definition
  f_header_ << "/* " << service_name_ << " handler (abstract base class) */" << endl << "struct _"
            << class_name << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << " parent;" << endl;
  indent_down();
  f_header_ << "};" << endl << "typedef struct _" << class_name << " " << class_name << ";" << endl
            << endl;

  // Generate the handler class definition, including its class members
  // (methods)
  f_header_ << "struct _" << class_name << "Class" << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << "Class parent;" << endl << endl;

  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    indent(f_header_) << "gboolean (*" << method_name << ") " << params << ";" << endl;
  }
  indent_down();

  f_header_ << "};" << endl << "typedef struct _" << class_name << "Class " << class_name
            << "Class;" << endl << endl;

  // Generate the remaining header boilerplate
  f_header_ << "GType " << class_name_lc << "_get_type (void);" << endl << "#define "
            << this->nspace_uc << "TYPE_" << service_name_uc << "_HANDLER "
            << "(" << class_name_lc << "_get_type())" << endl << "#define " << class_name_uc
            << "(obj) "
            << "(G_TYPE_CHECK_INSTANCE_CAST ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER(obj) "
            << "(G_TYPE_CHECK_INSTANCE_TYPE ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER))" << endl << "#define " << class_name_uc
            << "_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER_CLASS(c) "
            << "(G_TYPE_CHECK_CLASS_TYPE ((c), " << this->nspace_uc << "TYPE_" << service_name_uc
            << "_HANDLER))" << endl << "#define " << this->nspace_uc << service_name_uc
            << "_HANDLER_GET_CLASS(obj) "
            << "(G_TYPE_INSTANCE_GET_CLASS ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << endl;

  // Generate the handler class' method definitions
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    f_header_ << "gboolean " << class_name_lc << "_" << method_name << " " << params << ";" << endl;
  }
  f_header_ << endl;

  // Generate the handler's implementation in the implementation file

  // Generate the implementation boilerplate
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface);"
             << endl << endl;

  args_indent = string(25, ' ');
  f_service_ << "G_DEFINE_TYPE_WITH_CODE (" << class_name << ", " << endl << args_indent
             << class_name_lc << "," << endl << args_indent << parent_type_name << "," << endl
             << args_indent << "G_IMPLEMENT_INTERFACE (" << this->nspace_uc << "TYPE_"
             << service_name_uc << "_IF," << endl;
  args_indent += string(23, ' ');
  f_service_ << args_indent << class_name_lc << "_" << service_name_lc << "_if_interface_init))"
             << endl << endl;

  // Generate the handler method implementations
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    string method_name = initial_caps_to_underscores(function_name);
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();

    const vector<t_field*>& args = arg_list->get_members();
    const vector<t_field*>& xceptions = x_list->get_members();

    vector<t_field*>::const_iterator field_iter;

    t_function implementing_function(return_type,
                                     service_name_lc + "_handler_" + method_name,
                                     arg_list,
                                     x_list,
                                     (*function_iter)->is_oneway());

    indent(f_service_) << function_signature(&implementing_function) << endl;
    scope_up(f_service_);
    f_service_ << indent() << "g_return_val_if_fail (" << this->nspace_uc << "IS_"
               << service_name_uc << "_HANDLER (iface), FALSE);" << endl << endl << indent()
               << "return " << class_name_uc << "_GET_CLASS (iface)"
               << "->" << method_name << " (iface, ";

    if (!return_type->is_void()) {
      f_service_ << "_return, ";
    }
    for (field_iter = args.begin(); field_iter != args.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    for (field_iter = xceptions.begin(); field_iter != xceptions.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    f_service_ << "error);" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate the handler interface initializer
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
      string method_name = initial_caps_to_underscores((*function_iter)->get_name());

      f_service_ << indent() << "iface->" << method_name << " = " << class_name_lc << "_"
                 << method_name << ";" << endl;
    }
  }
  else {
    f_service_ << "THRIFT_UNUSED_VAR (iface);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler instance initializer
  f_service_ << "static void" << endl << class_name_lc << "_init (" << class_name << " *self)"
             << endl;
  scope_up(f_service_);
  f_service_ << indent() << "THRIFT_UNUSED_VAR (self);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler class initializer
  f_service_ << "static void" << endl
             << class_name_lc << "_class_init (" << class_name << "Class *cls)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin();
         function_iter != functions.end();
         ++function_iter) {
      string function_name = (*function_iter)->get_name();
      string method_name = initial_caps_to_underscores(function_name);

      // All methods are pure virtual and must be implemented by subclasses
      f_service_ << indent() << "cls->" << method_name << " = NULL;" << endl;
    }
  }
  else {
    f_service_ << indent() << "THRIFT_UNUSED_VAR (cls);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;
}